

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusutil_p.h
# Opt level: O3

bool QDBusUtil::checkObjectPath(QString *path,AllowEmptyFlag empty,QDBusError *error)

{
  ErrorType EVar1;
  qsizetype qVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  bool bVar7;
  bool bVar8;
  QArrayData *pQVar9;
  long in_FS_OFFSET;
  QAnyStringView QVar10;
  QByteArrayView QVar11;
  QString local_98;
  QDBusError local_78;
  QDBusError *local_38;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((path->d).size == 0) {
    if (empty == EmptyAllowed) {
      bVar8 = true;
      goto LAB_0012c2ef;
    }
    QVar11.m_data = (storage_type *)0x1b;
    QVar11.m_size = (qsizetype)&local_78;
    QString::fromLatin1(QVar11);
    local_98.d.d = (Data *)CONCAT44(local_78._4_4_,local_78.code);
    local_98.d.ptr = (char16_t *)local_78.msg.d.d;
    local_98.d.size = (qsizetype)local_78.msg.d.ptr;
    QDBusError::QDBusError(&local_78,InvalidObjectPath,&local_98);
    EVar1 = error->code;
    error->code = local_78.code;
    pQVar5 = &((error->msg).d.d)->super_QArrayData;
    pcVar6 = (error->msg).d.ptr;
    (error->msg).d.d = local_78.msg.d.d;
    (error->msg).d.ptr = local_78.msg.d.ptr;
    qVar2 = (error->msg).d.size;
    (error->msg).d.size = local_78.msg.d.size;
    pQVar9 = &((error->nm).d.d)->super_QArrayData;
    pcVar3 = (error->nm).d.ptr;
    (error->nm).d.d = local_78.nm.d.d;
    (error->nm).d.ptr = local_78.nm.d.ptr;
    qVar4 = (error->nm).d.size;
    (error->nm).d.size = local_78.nm.d.size;
    local_78.code = EVar1;
    local_78.msg.d.d = (Data *)pQVar5;
    local_78.msg.d.ptr = pcVar6;
    local_78.msg.d.size = qVar2;
    local_78.nm.d.ptr = pcVar3;
    local_78.nm.d.size = qVar4;
  }
  else {
    bVar7 = isValidObjectPath(path);
    bVar8 = true;
    if (bVar7) goto LAB_0012c2ef;
    local_78.msg.d.d = (Data *)(path->d).ptr;
    local_78.msg.d.ptr = (char16_t *)((path->d).size | 0x8000000000000000);
    local_38 = &local_78;
    local_78.code = CONCAT31(local_78.code._1_3_,1);
    local_30 = 0;
    QVar10.m_size = (size_t)"Invalid object path: %1";
    QVar10.field_0.m_data = &local_98;
    QtPrivate::argToQString(QVar10,0x4000000000000017,(ArgBase **)0x1);
    QDBusError::QDBusError(&local_78,InvalidObjectPath,&local_98);
    EVar1 = error->code;
    error->code = local_78.code;
    pQVar5 = &((error->msg).d.d)->super_QArrayData;
    pcVar6 = (error->msg).d.ptr;
    (error->msg).d.d = local_78.msg.d.d;
    (error->msg).d.ptr = local_78.msg.d.ptr;
    qVar2 = (error->msg).d.size;
    (error->msg).d.size = local_78.msg.d.size;
    pQVar9 = &((error->nm).d.d)->super_QArrayData;
    pcVar3 = (error->nm).d.ptr;
    (error->nm).d.d = local_78.nm.d.d;
    (error->nm).d.ptr = local_78.nm.d.ptr;
    qVar4 = (error->nm).d.size;
    (error->nm).d.size = local_78.nm.d.size;
    local_78.code = EVar1;
    local_78.msg.d.d = (Data *)pQVar5;
    local_78.msg.d.ptr = pcVar6;
    local_78.msg.d.size = qVar2;
    local_78.nm.d.ptr = pcVar3;
    local_78.nm.d.size = qVar4;
  }
  local_78.nm.d.d = (Data *)pQVar9;
  if (pQVar9 != (QArrayData *)0x0) {
    LOCK();
    (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar9->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar9->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar9,2,0x10);
    }
  }
  if (&(local_78.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.msg.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
    }
  }
  bVar8 = false;
LAB_0012c2ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar8;
  }
  __stack_chk_fail();
}

Assistant:

inline bool checkObjectPath(const QString &path, AllowEmptyFlag empty, QDBusError *error)
    {
        if (path.isEmpty()) {
            if (empty == EmptyAllowed) return true;
            *error = QDBusError(QDBusError::InvalidObjectPath, QLatin1StringView("Object path cannot be empty"));
            return false;
        }
        if (isValidObjectPath(path)) return true;
        *error = QDBusError(QDBusError::InvalidObjectPath, QLatin1StringView("Invalid object path: %1").arg(path));
        return false;
    }